

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_ftw.cpp
# Opt level: O2

void __thiscall edk2_ftw_t::_read(edk2_ftw_t *this)

{
  streamsize len;
  uint8_t uVar1;
  uint32_t uVar2;
  int iVar3;
  string local_30;
  
  kaitai::kstream::read_bytes_abi_cxx11_(&local_30,(this->super_kstruct).m__io,0x10);
  std::__cxx11::string::operator=((string *)&this->m_signature,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  uVar2 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_crc = uVar2;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_state = uVar1;
  kaitai::kstream::read_bytes_abi_cxx11_(&local_30,(this->super_kstruct).m__io,3);
  std::__cxx11::string::operator=((string *)&this->m_reserved,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  uVar2 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_len_write_queue_32 = uVar2;
  this->n_len_write_queue_64 = true;
  iVar3 = kaitai::kstream::mod(uVar2,0x10);
  if (iVar3 == 0) {
    this->n_len_write_queue_64 = false;
    uVar2 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_write_queue_64 = uVar2;
  }
  this->n_write_queue_32 = true;
  iVar3 = kaitai::kstream::mod(this->m_len_write_queue_32,0x10);
  if (iVar3 == 4) {
    this->n_write_queue_32 = false;
    kaitai::kstream::read_bytes_abi_cxx11_
              (&local_30,(this->super_kstruct).m__io,(ulong)this->m_len_write_queue_32);
    std::__cxx11::string::operator=((string *)&this->m_write_queue_32,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  this->n_write_queue_64 = true;
  iVar3 = kaitai::kstream::mod(this->m_len_write_queue_32,0x10);
  if (iVar3 == 0) {
    this->n_write_queue_64 = false;
    len._0_4_ = this->m_len_write_queue_32;
    len._4_4_ = this->m_len_write_queue_64;
    kaitai::kstream::read_bytes_abi_cxx11_(&local_30,(this->super_kstruct).m__io,len);
    std::__cxx11::string::operator=((string *)&this->m_write_queue_64,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void edk2_ftw_t::_read() {
    m_signature = m__io->read_bytes(16);
    m_crc = m__io->read_u4le();
    m_state = m__io->read_u1();
    m_reserved = m__io->read_bytes(3);
    m_len_write_queue_32 = m__io->read_u4le();
    n_len_write_queue_64 = true;
    if (kaitai::kstream::mod(len_write_queue_32(), 16) == 0) {
        n_len_write_queue_64 = false;
        m_len_write_queue_64 = m__io->read_u4le();
    }
    n_write_queue_32 = true;
    if (kaitai::kstream::mod(len_write_queue_32(), 16) == 4) {
        n_write_queue_32 = false;
        m_write_queue_32 = m__io->read_bytes(len_write_queue_32());
    }
    n_write_queue_64 = true;
    if (kaitai::kstream::mod(len_write_queue_32(), 16) == 0) {
        n_write_queue_64 = false;
        m_write_queue_64 = m__io->read_bytes(((static_cast<uint64_t>(len_write_queue_64()) << 32) + len_write_queue_32()));
    }
}